

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O3

void __thiscall
smf::MidiMessage::makeTemperamentPythagorean
          (MidiMessage *this,int referencePitchClass,int channelMask)

{
  pointer pdVar1;
  vector<double,_std::allocator<double>_> local_38;
  
  pdVar1 = (pointer)operator_new(0x60);
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1 + 0xc;
  *(undefined4 *)pdVar1 = 0;
  *(undefined4 *)((long)pdVar1 + 4) = 0;
  *(undefined4 *)(pdVar1 + 1) = 0x5dfce840;
  *(undefined4 *)((long)pdVar1 + 0xc) = 0xc0238ccd;
  pdVar1[2] = 3.910001730774866;
  pdVar1[3] = -5.865002596162299;
  pdVar1[8] = -7.820003461549732;
  pdVar1[9] = 5.865002596162299;
  pdVar1[4] = 7.820003461549732;
  pdVar1[5] = -1.955000865387433;
  pdVar1[10] = -3.910001730774866;
  pdVar1[0xb] = 9.775004326937164;
  pdVar1[6] = 11.730005192324597;
  pdVar1[7] = 1.955000865387433;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar1;
  local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_38.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  makeMts9_TemperamentByCentsDeviationFromET(this,&local_38,referencePitchClass,channelMask);
  operator_delete(pdVar1);
  return;
}

Assistant:

void MidiMessage::makeTemperamentPythagorean(int referencePitchClass, int channelMask) {
	std::vector<double> temperament(12);
	double x = 1200.0 * log2(3.0 / 2.0);
	temperament[1]  = x * -5 + 3500; // -9.775 cents
	temperament[8]  = x * -4 + 2800; // -7.820 cents
	temperament[3]  = x * -3 + 2100; // -5.865 cents
	temperament[10] = x * -2 + 1400; // -3.910 cents
	temperament[5]  = x * -1 + 700;  // -1.955 cents
	temperament[0]  = 0.0;           //  0     cents
	temperament[7]  = x * 1 - 700;   //  1.955 cents
	temperament[2]  = x * 2 - 1400;  //  3.910 cents
	temperament[9]  = x * 3 - 2100;  //  5.865 cents
	temperament[4]  = x * 4 - 2800;  //  7.820 cents
	temperament[11] = x * 5 - 3500;  //  9.775 cents
	temperament[6]  = x * 6 - 4200;  // 11.730 cents
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}